

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# suffixtree.cpp
# Opt level: O1

void __thiscall
SuffixTree::GeneralizedSuffixTree::DumpNode(GeneralizedSuffixTree *this,Node *node,FILE *file)

{
  GeneralizedSuffixTree *this_00;
  long *plVar1;
  size_type *psVar2;
  _Hash_node_base *p_Var3;
  long *local_78 [2];
  long local_68 [2];
  GeneralizedSuffixTree *local_58;
  size_type *local_50;
  string label;
  
  local_58 = this;
  fprintf((FILE *)file,"p%p [shape=circle label=\"%u; %u\"]\n",node,(ulong)node->num_leaves,
          (ulong)node->num_lca);
  p_Var3 = (node->edges)._M_h._M_before_begin._M_nxt;
  if (p_Var3 != (_Hash_node_base *)0x0) {
    do {
      this_00 = local_58;
      if (*(int *)&p_Var3[4]._M_nxt == 0) {
        std::__cxx11::string::substr
                  ((ulong)local_78,
                   (ulong)((local_58->strings).
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start + *(uint *)&p_Var3[3]._M_nxt));
        plVar1 = (long *)std::__cxx11::string::append((char *)local_78);
        psVar2 = (size_type *)(plVar1 + 2);
        if ((size_type *)*plVar1 == psVar2) {
          label._M_string_length = *psVar2;
          label.field_2._M_allocated_capacity = plVar1[3];
          local_50 = &label._M_string_length;
        }
        else {
          label._M_string_length = *psVar2;
          local_50 = (size_type *)*plVar1;
        }
        label._M_dataplus._M_p = (pointer)plVar1[1];
        *plVar1 = (long)psVar2;
        plVar1[1] = 0;
        *(undefined1 *)(plVar1 + 2) = 0;
        if (local_78[0] != local_68) {
          operator_delete(local_78[0],local_68[0] + 1);
        }
        fprintf((FILE *)file,"p%p -> p%p [label=\"%s\"]\n",node,p_Var3[2]._M_nxt,local_50);
        fprintf((FILE *)file,"p%p [style=filled color=grey shape=circle label=\"%u\"]\n",
                p_Var3[2]._M_nxt,(ulong)*(uint *)&p_Var3[2]._M_nxt[1]._M_nxt);
      }
      else {
        std::__cxx11::string::substr
                  ((ulong)&local_50,
                   (ulong)((local_58->strings).
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start + *(uint *)&p_Var3[3]._M_nxt));
        fprintf((FILE *)file,"p%p -> p%p [label=\"%s\"]\n",node,p_Var3[2]._M_nxt,local_50);
        DumpNode(this_00,(Node *)p_Var3[2]._M_nxt,file);
      }
      if (local_50 != &label._M_string_length) {
        operator_delete(local_50,label._M_string_length + 1);
      }
      p_Var3 = p_Var3->_M_nxt;
    } while (p_Var3 != (_Hash_node_base *)0x0);
  }
  return;
}

Assistant:

void GeneralizedSuffixTree::DumpNode (Node *node, FILE *file)
{
    // dump style of current node
    fprintf (file, "p%p [shape=circle label=\"%u; %u\"]\n",
             static_cast<void *> (node), node->num_leaves, node->num_lca);
    // process all child of current node
    for (const auto &edge_pair : node->edges)
    {
        const Edge &edge = edge_pair.second;
        if (edge.length)
        {
            // child is node
            std::string label = strings[edge.string_number].substr (edge.start, edge.length);
            fprintf (file, "p%p -> p%p [label=\"%s\"]\n",
                     static_cast<void *> (node), static_cast<void *> (edge.node), label.c_str());
            DumpNode (edge.node, file);
        }
        else
        {
            // child is leaf
            std::string label = strings[edge.string_number].substr (edge.start) + "$";
            fprintf (file, "p%p -> p%p [label=\"%s\"]\n",
                     static_cast<void *> (node), static_cast<void *> (edge.leaf), label.c_str());
            fprintf (file, "p%p [style=filled color=grey shape=circle label=\"%u\"]\n",
                     static_cast<void *> (edge.leaf), edge.leaf->string_number);
        }
    }
}